

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPExternalTransmitter::Init(RTPExternalTransmitter *this,bool tsafe)

{
  bool tsafe_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    if (tsafe) {
      this_local._4_4_ = -2;
    }
    else {
      this->init = true;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0x8c;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::Init(bool tsafe)
{
	if (init)
		return ERR_RTP_EXTERNALTRANS_ALREADYINIT;
	
#ifdef RTP_SUPPORT_THREAD
	threadsafe = tsafe;
	if (threadsafe)
	{
		int status;
		
		status = mainmutex.Init();
		if (status < 0)
			return ERR_RTP_EXTERNALTRANS_CANTINITMUTEX;
		status = waitmutex.Init();
		if (status < 0)
			return ERR_RTP_EXTERNALTRANS_CANTINITMUTEX;
	}
#else
	if (tsafe)
		return ERR_RTP_NOTHREADSUPPORT;
#endif // RTP_SUPPORT_THREAD

	init = true;
	return 0;
}